

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

void Curl_expire_ex(Curl_easy *data,curltime *nowp,timediff_t milli,expire_id id)

{
  Curl_llist *list;
  curltime *pcVar1;
  int iVar2;
  undefined4 uVar3;
  Curl_multi *pCVar4;
  curl_trc_feat *pcVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  time_node *ptVar12;
  uint uVar13;
  size_t sVar14;
  Curl_llist_node *n;
  void *pvVar15;
  timediff_t tVar16;
  Curl_llist_node *pCVar17;
  Curl_tree *pCVar18;
  int iVar19;
  Curl_llist_node *e;
  time_node *ne;
  long lVar20;
  curltime newer;
  curltime i;
  curltime newer_00;
  curltime older;
  curltime older_00;
  
  pCVar4 = data->multi;
  if (pCVar4 != (Curl_multi *)0x0) {
    uVar3 = *(undefined4 *)&nowp->field_0xc;
    iVar19 = (int)(milli % 1000) * 1000;
    iVar2 = nowp->tv_usec + iVar19;
    iVar19 = nowp->tv_usec + -1000000 + iVar19;
    if (iVar2 < 1000000) {
      iVar19 = iVar2;
    }
    lVar20 = (ulong)(999999 < iVar2) + milli / 1000 + nowp->tv_sec;
    multi_deltimeout(data,id);
    list = &(data->state).timeoutlist;
    ne = (data->state).expires + id;
    (data->state).expires[id].time.tv_sec = lVar20;
    (data->state).expires[id].time.tv_usec = iVar19;
    *(undefined4 *)&(data->state).expires[id].time.field_0xc = uVar3;
    (data->state).expires[id].eid = id;
    sVar14 = Curl_llist_count(list);
    if (sVar14 == 0) {
      e = (Curl_llist_node *)0x0;
    }
    else {
      n = Curl_llist_head(list);
      e = (Curl_llist_node *)0x0;
      while (n != (Curl_llist_node *)0x0) {
        pvVar15 = Curl_node_elem(n);
        ptVar12 = (data->state).expires + id;
        uVar6 = (ptVar12->time).tv_sec;
        uVar7 = (ptVar12->time).tv_usec;
        older.tv_usec = uVar7;
        older.tv_sec = uVar6;
        newer._12_4_ = 0;
        newer._0_12_ = *(undefined1 (*) [12])((long)pvVar15 + 0x20);
        older._12_4_ = 0;
        tVar16 = Curl_timediff(newer,older);
        if (0 < tVar16) break;
        pCVar17 = Curl_node_next(n);
        e = n;
        n = pCVar17;
      }
    }
    Curl_llist_insert_next(list,e,ne,&ne->list);
    pcVar1 = &(data->state).expiretime;
    uVar10 = pcVar1->tv_sec;
    uVar11 = pcVar1->tv_usec;
    older_00.tv_usec = uVar11;
    older_00.tv_sec = uVar10;
    if (pcVar1->tv_sec != 0 || (data->state).expiretime.tv_usec != 0) {
      newer_00.tv_usec = iVar19;
      newer_00.tv_sec = lVar20;
      newer_00._12_4_ = 0;
      older_00._12_4_ = 0;
      tVar16 = Curl_timediff(newer_00,older_00);
      if (0 < tVar16) {
        return;
      }
      uVar13 = Curl_splayremove(pCVar4->timetree,&(data->state).timenode,&pCVar4->timetree);
      if (((uVar13 != 0) && (((data->set).field_0x89f & 0x40) != 0)) &&
         ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))))
      {
        Curl_infof(data,"Internal error removing splay node = %d",(ulong)uVar13);
      }
    }
    (data->state).expiretime.tv_sec = lVar20;
    (data->state).expiretime.tv_usec = iVar19;
    *(undefined4 *)&(data->state).expiretime.field_0xc = uVar3;
    pCVar18 = &(data->state).timenode;
    Curl_splayset(pCVar18,data);
    uVar8 = (data->state).expiretime.tv_sec;
    uVar9 = (data->state).expiretime.tv_usec;
    i.tv_usec = uVar9;
    i.tv_sec = uVar8;
    i._12_4_ = 0;
    pCVar18 = Curl_splayinsert(i,pCVar4->timetree,pCVar18);
    pCVar4->timetree = pCVar18;
  }
  return;
}

Assistant:

void Curl_expire_ex(struct Curl_easy *data,
                    const struct curltime *nowp,
                    timediff_t milli, expire_id id)
{
  struct Curl_multi *multi = data->multi;
  struct curltime *curr_expire = &data->state.expiretime;
  struct curltime set;

  /* this is only interesting while there is still an associated multi struct
     remaining! */
  if(!multi)
    return;

  DEBUGASSERT(id < EXPIRE_LAST);

  set = *nowp;
  set.tv_sec += (time_t)(milli/1000); /* might be a 64 to 32 bits conversion */
  set.tv_usec += (int)(milli%1000)*1000;

  if(set.tv_usec >= 1000000) {
    set.tv_sec++;
    set.tv_usec -= 1000000;
  }

  /* Remove any timer with the same id just in case. */
  multi_deltimeout(data, id);

  /* Add it to the timer list. It must stay in the list until it has expired
     in case we need to recompute the minimum timer later. */
  multi_addtimeout(data, &set, id);

  if(curr_expire->tv_sec || curr_expire->tv_usec) {
    /* This means that the struct is added as a node in the splay tree.
       Compare if the new time is earlier, and only remove-old/add-new if it
       is. */
    timediff_t diff = Curl_timediff(set, *curr_expire);
    int rc;

    if(diff > 0) {
      /* The current splay tree entry is sooner than this new expiry time.
         We do not need to update our splay tree entry. */
      return;
    }

    /* Since this is an updated time, we must remove the previous entry from
       the splay tree first and then re-add the new value */
    rc = Curl_splayremove(multi->timetree, &data->state.timenode,
                          &multi->timetree);
    if(rc)
      infof(data, "Internal error removing splay node = %d", rc);
  }

  /* Indicate that we are in the splay tree and insert the new timer expiry
     value since it is our local minimum. */
  *curr_expire = set;
  Curl_splayset(&data->state.timenode, data);
  multi->timetree = Curl_splayinsert(*curr_expire, multi->timetree,
                                     &data->state.timenode);
}